

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O3

bool __thiscall zmq::msg_t::rm_refs(msg_t *this,int refs_)

{
  atomic_counter_t *paVar1;
  content_t *pcVar2;
  uchar uVar3;
  int __fd;
  undefined8 *__ptr;
  
  __fd = refs_;
  if (refs_ < 0) {
    rm_refs();
  }
  if ((this->_u).base.metadata != (metadata_t *)0x0) {
    rm_refs();
  }
  if (refs_ == 0) {
    return true;
  }
  uVar3 = (this->_u).base.type;
  if (((uVar3 == 'i') || (uVar3 == 'f')) && ((char)(this->_u).base.flags < '\0')) {
    if (uVar3 == 'f') {
      LOCK();
      paVar1 = &((this->_u).lmsg.content)->refcnt;
      (paVar1->_value).super___atomic_base<unsigned_int>._M_i =
           (paVar1->_value).super___atomic_base<unsigned_int>._M_i - refs_;
      UNLOCK();
      if ((paVar1->_value).super___atomic_base<unsigned_int>._M_i == 0) {
        __ptr = (undefined8 *)(this->_u).cmsg.data;
        if ((code *)__ptr[2] != (code *)0x0) {
          (*(code *)__ptr[2])(*__ptr,__ptr[3]);
          __ptr = (undefined8 *)(this->_u).cmsg.data;
        }
        free(__ptr);
        return false;
      }
      uVar3 = (this->_u).base.type;
    }
    if (uVar3 != 'i') {
      return true;
    }
    LOCK();
    paVar1 = &((this->_u).lmsg.content)->refcnt;
    (paVar1->_value).super___atomic_base<unsigned_int>._M_i =
         (paVar1->_value).super___atomic_base<unsigned_int>._M_i - refs_;
    UNLOCK();
    if ((paVar1->_value).super___atomic_base<unsigned_int>._M_i != 0) {
      return true;
    }
    pcVar2 = (this->_u).lmsg.content;
    if ((code *)pcVar2->ffn != (code *)0x0) {
      (*(code *)pcVar2->ffn)(pcVar2->data,pcVar2->hint);
    }
  }
  else {
    close(this,__fd);
  }
  return false;
}

Assistant:

bool zmq::msg_t::rm_refs (int refs_)
{
    zmq_assert (refs_ >= 0);

    //  Operation not supported for messages with metadata.
    zmq_assert (_u.base.metadata == NULL);

    //  No copies required.
    if (!refs_)
        return true;

    //  If there's only one reference close the message.
    if ((_u.base.type != type_zclmsg && _u.base.type != type_lmsg)
        || !(_u.base.flags & msg_t::shared)) {
        close ();
        return false;
    }

    //  The only message type that needs special care are long and zcopy messages.
    if (_u.base.type == type_lmsg && !_u.lmsg.content->refcnt.sub (refs_)) {
        //  We used "placement new" operator to initialize the reference
        //  counter so we call the destructor explicitly now.
        _u.lmsg.content->refcnt.~atomic_counter_t ();

        if (_u.lmsg.content->ffn)
            _u.lmsg.content->ffn (_u.lmsg.content->data, _u.lmsg.content->hint);
        free (_u.lmsg.content);

        return false;
    }

    if (is_zcmsg () && !_u.zclmsg.content->refcnt.sub (refs_)) {
        // storage for rfcnt is provided externally
        if (_u.zclmsg.content->ffn) {
            _u.zclmsg.content->ffn (_u.zclmsg.content->data,
                                    _u.zclmsg.content->hint);
        }

        return false;
    }

    return true;
}